

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  vector<board::Undo,_std::allocator<board::Undo>_> *this;
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  allocator<char> local_1f59;
  Move move;
  SearchInfo info;
  string input;
  Board pos;
  
  board::Board::INIT();
  search::movegen::INIT();
  board::Board::Board(&pos);
  move.value = 0;
  move.score = 0;
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  this = &pos.history;
LAB_00102584:
  do {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    board::Board::print(&pos);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
              ((vector<board::Undo,_std::allocator<board::Undo>_> *)&info,this);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar5,": ");
    std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base
              ((_Vector_base<board::Undo,_std::allocator<board::Undo>_> *)&info);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&input);
    bVar3 = std::operator==(&input,"uci");
    if (bVar3) {
      io::uci::loop();
LAB_00102875:
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::~string((string *)&input);
      std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base
                (&this->super__Vector_base<board::Undo,_std::allocator<board::Undo>_>);
      return 0;
    }
    bVar3 = std::operator==(&input,"q");
    if (bVar3) goto LAB_00102875;
    bVar3 = std::operator==(&input,"n");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&info,board::Board::DEFAULT_FEN,&local_1f59);
      board::Board::parseFen(&pos,(string *)&info);
LAB_00102655:
      std::__cxx11::string::~string((string *)&info);
      goto LAB_00102584;
    }
    if (2 < input._M_string_length) {
      std::__cxx11::string::substr((ulong)&info,(ulong)&input);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &info,"n ");
      std::__cxx11::string::~string((string *)&info);
      if (bVar3) {
        std::__cxx11::string::substr((ulong)&info,(ulong)&input);
        bVar3 = board::Board::parseFen(&pos,(string *)&info);
        std::__cxx11::string::~string((string *)&info);
        if (!bVar3) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar5 = std::operator<<((ostream *)&std::cout,"ERROR Invalid FEN");
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&info,board::Board::DEFAULT_FEN,&local_1f59);
          board::Board::parseFen(&pos,(string *)&info);
          goto LAB_00102655;
        }
        goto LAB_00102584;
      }
    }
    bVar3 = std::operator==(&input,"u");
    if (bVar3) {
      std::vector<board::Undo,_std::allocator<board::Undo>_>::vector
                ((vector<board::Undo,_std::allocator<board::Undo>_> *)&info,this);
      lVar1 = CONCAT44(info._4_4_,info.depth);
      lVar2 = CONCAT44(info.startTime._4_4_,(undefined4)info.startTime);
      std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base
                ((_Vector_base<board::Undo,_std::allocator<board::Undo>_> *)&info);
      if (lVar1 != lVar2) {
        board::makemove::undo(&pos);
      }
    }
    else {
      bVar3 = std::operator==(&input,"s");
      if (bVar3) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        info.depth = -1;
        info.nodes = -1;
        info.startTime._0_4_ = 0xffffffff;
        info.startTime._4_4_ = 0xffffffff;
        info.stopTime._0_4_ = 0xffffffff;
        info.stopTime._4_4_ = 0xffffffff;
        info.quit = false;
        info.stopped = false;
        search::go();
      }
      else {
        bVar3 = std::operator==(&input,"e");
        if (bVar3) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar5 = std::operator<<((ostream *)&std::cout,"Evaluation: ");
          iVar4 = board::evaluate::score(&pos);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          move = io::parseMove(&input,&pos);
          bVar3 = board::makemove::move(&move,&pos);
          if (!bVar3) {
            uVar6 = __cxa_rethrow();
            __cxa_end_catch();
            std::__cxx11::string::~string((string *)&input);
            std::_Vector_base<board::Undo,_std::allocator<board::Undo>_>::~_Vector_base
                      (&this->super__Vector_base<board::Undo,_std::allocator<board::Undo>_>);
            _Unwind_Resume(uVar6);
          }
        }
      }
    }
  } while( true );
}

Assistant:

int main()
{
    board::Board::INIT();
    search::movegen::INIT();
    board::Board pos;
    board::Move move;
    std::string input;
    while (true) {
        std::cout << std::endl;
        pos.print();
        std::cout << std::endl;
        std::cout << ((pos.getHistory().size() / 2) + 1) << ": ";
        std::getline(std::cin, input);
        if (input == "uci") {
            io::uci::loop();
            break;
        }
        if (input == "q") {
            break;
        }
        if (input == "n") {
            pos.parseFen(board::Board::DEFAULT_FEN);
        }
        else if (input.length() > 2 && input.substr(0, 2) == "n ") {
            if (!pos.parseFen(input.substr(2))) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid FEN" << std::endl;
                pos.parseFen(board::Board::DEFAULT_FEN);
            }
        }
        else if (input == "u") {
            if (!pos.getHistory().empty()) {
                board::makemove::undo(pos);
            }
        }
        else if (input == "s") {
            std::cout << std::endl;
            search::SearchInfo info(-1);
            search::go(pos, info);
        }
        else if (input == "e") {
            std::cout << std::endl;
            std::cout << "Evaluation: " << board::evaluate::score(pos) << std::endl;
        }
        else {
            try {
                move = io::parseMove(input, pos);
                if (!board::makemove::move(move, pos)) {
                    throw;
                }
            }
            catch (int) {
                std::cout << std::endl;
                std::cout << "ERROR Invalid input" << std::endl;
            }
        }
    }
    std::cout << std::endl;
    return 0;
}